

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>::matches
          (Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *this,
          candidate_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> candidate)

{
  bool bVar1;
  bool local_31;
  MatchSelf<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> local_21;
  matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> local_20;
  candidate_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> local_1c;
  matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> casted;
  candidate_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> candidate_local;
  Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *this_local;
  
  local_1c = candidate;
  _casted = this;
  bVar1 = dynCastCandidate<wasm::Match::Internal::AnyKind<wasm::BinaryOp>,_0>(candidate,&local_20);
  if (bVar1) {
    if (this->binder != (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0) {
      *this->binder = local_20;
    }
    bVar1 = MatchSelf<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>::operator()
                      (&local_21,local_20);
    local_31 = false;
    if (bVar1) {
      local_31 = Components<wasm::Match::Internal::AnyKind<wasm::BinaryOp>,_0,_void>::match
                           (local_20);
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }